

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SteepestDescent.cpp
# Opt level: O0

DynamicVector<double,_std::allocator<double>_> * __thiscall
QuantLib::SteepestDescent::getUpdatedDirection
          (SteepestDescent *this,Problem *param_2,RealType param_3,
          DynamicVector<double,_std::allocator<double>_> *param_4)

{
  DynamicVector<double,_std::allocator<double>_> *in_RDX;
  long in_RSI;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  
  LineSearch::lastGradient(*(LineSearch **)(in_RSI + 8));
  OpenMD::operator-(in_RDX);
  return in_RDI;
}

Assistant:

DynamicVector<RealType> SteepestDescent::getUpdatedDirection(
      const Problem&, RealType, const DynamicVector<RealType>&) {
    return -lineSearch_->lastGradient();
  }